

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitStartupYield(ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((JumpCleanupList *)
      (byteCodeGenerator->jumpCleanupList->super_DListBase<JumpCleanupInfo,_RealCount>).
      super_DListNodeBase<JumpCleanupInfo>.next.base != byteCodeGenerator->jumpCleanupList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2938,"(!byteCodeGenerator->HasJumpCleanup())",
                       "!byteCodeGenerator->HasJumpCleanup()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Js::ByteCodeWriter::Reg1(&byteCodeGenerator->m_writer,LdUndef,funcInfo->yieldRegister);
  Js::ByteCodeWriter::Reg2
            (&byteCodeGenerator->m_writer,Yield,funcInfo->yieldRegister,funcInfo->yieldRegister);
  return;
}

Assistant:

void EmitStartupYield(ByteCodeGenerator* byteCodeGenerator, FuncInfo* funcInfo)
{
    // Generators are "paused" after evaluating the parameter list. A synthetic
    // yield is inserted at the beginning of the function for this purpose. It
    // has the following special properties: it can only be resumed with a "normal"
    // completion (the other types are handled in the generator logic), the
    // resume value is not observable to user code, and it cannot be contained
    // within a try scope.
    Assert(!byteCodeGenerator->HasJumpCleanup());
    auto* writer = byteCodeGenerator->Writer();
    writer->Reg1(Js::OpCode::LdUndef, funcInfo->yieldRegister);
    writer->Reg2(Js::OpCode::Yield, funcInfo->yieldRegister, funcInfo->yieldRegister);
}